

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

void __thiscall
despot::util::tinyxml::TiXmlAttribute::Print
          (TiXmlAttribute *this,FILE *cfile,int param_2,TiXmlString *str)

{
  size_type sVar1;
  char *suffix;
  TiXmlString v;
  TiXmlString n;
  
  n.rep_ = (Rep *)TiXmlString::nullrep_;
  v.rep_ = (Rep *)TiXmlString::nullrep_;
  TiXmlBase::EncodeString(&this->name,&n);
  TiXmlBase::EncodeString(&this->value,&v);
  sVar1 = TiXmlString::find(&this->value,'\"');
  if (sVar1 == 0xffffffffffffffff) {
    if (cfile != (FILE *)0x0) {
      fprintf((FILE *)cfile,"%s=\"%s\"",(n.rep_)->str,(v.rep_)->str);
    }
    if (str == (TiXmlString *)0x0) goto LAB_001785b4;
    TiXmlString::operator+=(str,&n);
    TiXmlString::operator+=(str,"=\"");
    TiXmlString::operator+=(str,&v);
    suffix = "\"";
  }
  else {
    if (cfile != (FILE *)0x0) {
      fprintf((FILE *)cfile,"%s=\'%s\'",(n.rep_)->str,(v.rep_)->str);
    }
    if (str == (TiXmlString *)0x0) goto LAB_001785b4;
    TiXmlString::operator+=(str,&n);
    TiXmlString::operator+=(str,"=\'");
    TiXmlString::operator+=(str,&v);
    suffix = "\'";
  }
  TiXmlString::operator+=(str,suffix);
LAB_001785b4:
  TiXmlString::quit(&v);
  TiXmlString::quit(&n);
  return;
}

Assistant:

void TiXmlAttribute::Print(FILE* cfile, int /*depth*/,
	TIXML_STRING* str) const {
	TIXML_STRING n, v;

	EncodeString(name, &n);
	EncodeString(value, &v);

	if (value.find('\"') == TIXML_STRING::npos) {
		if (cfile) {
			fprintf(cfile, "%s=\"%s\"", n.c_str(), v.c_str());
		}
		if (str) {
			(*str) += n;
			(*str) += "=\"";
			(*str) += v;
			(*str) += "\"";
		}
	} else {
		if (cfile) {
			fprintf(cfile, "%s='%s'", n.c_str(), v.c_str());
		}
		if (str) {
			(*str) += n;
			(*str) += "='";
			(*str) += v;
			(*str) += "'";
		}
	}
}